

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O3

char * c_escape(char *str,size_t len)

{
  byte bVar1;
  byte *pbVar2;
  ushort **ppuVar3;
  byte *pbVar4;
  
  if (len == 0xffffffffffffffff) {
    len = strlen(str);
  }
  if ((len >> 0x3e != 0) ||
     (pbVar2 = (byte *)malloc(len * 4 + 1), pbVar4 = pbVar2, pbVar2 == (byte *)0x0)) {
    return (char *)0x0;
  }
  do {
    bVar1 = *str;
    if (bVar1 < 0xd) {
      if (bVar1 == 9) {
        pbVar4[2] = 0;
        pbVar4[0] = 0x5c;
        pbVar4[1] = 0x74;
        goto LAB_0011a0f8;
      }
      if (bVar1 == 10) {
        pbVar4[2] = 0;
        pbVar4[0] = 0x5c;
        pbVar4[1] = 0x6e;
        goto LAB_0011a0f8;
      }
      if (bVar1 == 0) {
        *pbVar4 = 0;
        return (char *)pbVar2;
      }
LAB_0011a106:
      ppuVar3 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar3 + (ulong)bVar1 * 2 + 1) & 0x40) == 0) {
        curl_msnprintf(pbVar4,5,"\\%03o",bVar1);
        pbVar4 = pbVar4 + 4;
      }
      else {
        *pbVar4 = bVar1;
        pbVar4 = pbVar4 + 1;
      }
    }
    else {
      if (bVar1 == 0xd) {
        pbVar4[2] = 0;
        pbVar4[0] = 0x5c;
        pbVar4[1] = 0x72;
      }
      else if (bVar1 == 0x22) {
        pbVar4[2] = 0;
        pbVar4[0] = 0x5c;
        pbVar4[1] = 0x22;
      }
      else {
        if (bVar1 != 0x5c) goto LAB_0011a106;
        pbVar4[2] = 0;
        pbVar4[0] = 0x5c;
        pbVar4[1] = 0x5c;
      }
LAB_0011a0f8:
      pbVar4 = pbVar4 + 2;
    }
    str = (char *)((byte *)str + 1);
  } while( true );
}

Assistant:

static char *c_escape(const char *str, size_t len)
{
  const char *s;
  unsigned char c;
  char *escaped, *e;

  if(len == CURL_ZERO_TERMINATED)
    len = strlen(str);

  /* Check for possible overflow. */
  if(len > (~(size_t) 0) / 4)
    return NULL;

  /* Allocate space based on worst-case */
  escaped = malloc(4 * len + 1);
  if(!escaped)
    return NULL;

  e = escaped;
  for(s = str; (c = *s) != '\0'; s++) {
    if(c == '\n') {
      strcpy(e, "\\n");
      e += 2;
    }
    else if(c == '\r') {
      strcpy(e, "\\r");
      e += 2;
    }
    else if(c == '\t') {
      strcpy(e, "\\t");
      e += 2;
    }
    else if(c == '\\') {
      strcpy(e, "\\\\");
      e += 2;
    }
    else if(c == '"') {
      strcpy(e, "\\\"");
      e += 2;
    }
    else if(! isprint(c)) {
      snprintf(e, 5, "\\%03o", (unsigned)c);
      e += 4;
    }
    else
      *e++ = c;
  }
  *e = '\0';
  return escaped;
}